

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::enable(backtracer *this,size_t size)

{
  circular_q<spdlog::details::log_msg_buffer> *in_RDI;
  lock_guard<std::mutex> lock;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_ffffffffffffffa0;
  memory_order in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  atomic<bool> *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,(mutex_type *)in_RDI);
  std::atomic<bool>::store
            (in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0);
  circular_q<spdlog::details::log_msg_buffer>::circular_q
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  circular_q<spdlog::details::log_msg_buffer>::operator=(in_stack_ffffffffffffffa0,in_RDI);
  circular_q<spdlog::details::log_msg_buffer>::~circular_q
            ((circular_q<spdlog::details::log_msg_buffer> *)0x15ad52);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15ad5c);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::enable(size_t size)
{
    std::lock_guard<std::mutex> lock{mutex_};
    enabled_.store(true, std::memory_order_relaxed);
    messages_ = circular_q<log_msg_buffer>{size};
}